

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefValue.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
BeliefValue::GetValues(BeliefSet *Beliefs,ValueFunctionPOMDPDiscrete *V)

{
  size_type sVar1;
  size_type sVar2;
  const_reference ppJVar3;
  const_reference this;
  vector<double,_std::allocator<double>_> *pvVar4;
  reference pvVar5;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *in_RDX;
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  value_type vVar6;
  int i;
  int b;
  double x;
  int nrB;
  int nrInV;
  vector<double,_std::allocator<double>_> *values;
  allocator_type *in_stack_ffffffffffffff68;
  value_type vVar7;
  value_type_conflict3 *in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff78;
  long *plVar8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff80;
  int local_58;
  int local_54;
  
  sVar1 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::size(in_RDX);
  sVar2 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::size(in_RSI)
  ;
  std::allocator<double>::allocator((allocator<double> *)0x8fe837);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  std::allocator<double>::~allocator((allocator<double> *)0x8fe85c);
  for (local_54 = 0; local_54 != (int)sVar2; local_54 = local_54 + 1) {
    for (local_58 = 0; local_58 != (int)sVar1; local_58 = local_58 + 1) {
      ppJVar3 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::
                operator[](in_RSI,(long)local_54);
      plVar8 = (long *)((long)&(*ppJVar3)->field_0x0 + *(long *)((long)**ppJVar3 + -0xb8));
      this = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::operator[]
                       (in_RDX,(long)local_58);
      pvVar4 = AlphaVector::GetValues(this);
      vVar6 = (value_type)(**(code **)(*plVar8 + 0x80))(plVar8,pvVar4);
      vVar7 = vVar6;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)local_54);
      if (*pvVar5 < vVar7) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)local_54);
        *pvVar5 = vVar6;
      }
    }
  }
  return in_RDI;
}

Assistant:

vector<double> BeliefValue::GetValues(const BeliefSet &Beliefs,
                                      const ValueFunctionPOMDPDiscrete &V)
{
    int nrInV=V.size();
    int nrB=Beliefs.size();

    vector<double> values(nrB,-DBL_MAX);
    double x;

    for(int b=0;b!=nrB;b++)
        for(int i=0;i!=nrInV;i++)
        {
            // compute inner product of belief with vector
            x=Beliefs[b]->InnerProduct(V[i].GetValues());

            // keep the maximizing value
            if(x>values[b])
                values[b]=x;
        }
    
    return(values);
}